

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateCodecCode
          (WrapperFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = "pb::FieldCodec.ForClassWrapper<$type_name$>($tag$)";
  if (this->is_value_type != false) {
    text = "pb::FieldCodec.ForStructWrapper<$nonnullable_type_name$>($tag$)";
  }
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateCodecCode(io::Printer* printer) {
  if (is_value_type) {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForStructWrapper<$nonnullable_type_name$>($tag$)");
  } else {
    printer->Print(
      variables_,
      "pb::FieldCodec.ForClassWrapper<$type_name$>($tag$)");
  }
}